

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

AssertionExpr *
slang::ast::AbortAssertionExpr::fromSyntax(AcceptOnPropertyExprSyntax *syntax,ASTContext *context)

{
  TokenKind TVar1;
  Compilation *this;
  int iVar2;
  Expression *this_00;
  undefined4 extraout_var;
  AbortAssertionExpr *pAVar3;
  bool bVar4;
  bool isSync;
  Action action;
  bool local_45;
  Action local_44;
  SampledValueExprVisitor local_40;
  
  this = ((context->scope).ptr)->compilation;
  this_00 = bindExpr((syntax->condition).ptr,context,false,true);
  iVar2 = AssertionExpr::bind((AssertionExpr *)(syntax->expr).ptr,(int)context,(sockaddr *)0x0,0);
  TVar1 = (syntax->keyword).kind;
  local_45 = Supply1Keyword < TVar1;
  if (local_45) {
    bVar4 = TVar1 != SyncAcceptOnKeyword;
  }
  else {
    bVar4 = TVar1 != AcceptOnKeyword;
  }
  local_44 = (Action)bVar4;
  local_40.isFutureGlobal = false;
  local_40.localVarCode.subsystem = Statements;
  local_40.localVarCode.code = 0x33;
  local_40.matchedCode.subsystem = Statements;
  local_40.matchedCode.code = 0x34;
  local_40.context = context;
  Expression::visitExpression<slang::ast::Expression_const,slang::ast::SampledValueExprVisitor&>
            (this_00,this_00,&local_40);
  pAVar3 = BumpAllocator::
           emplace<slang::ast::AbortAssertionExpr,slang::ast::Expression_const&,slang::ast::AssertionExpr_const&,slang::ast::AbortAssertionExpr::Action&,bool&>
                     (&this->super_BumpAllocator,this_00,
                      (AssertionExpr *)CONCAT44(extraout_var,iVar2),&local_44,&local_45);
  return &pAVar3->super_AssertionExpr;
}

Assistant:

AssertionExpr& AbortAssertionExpr::fromSyntax(const AcceptOnPropertyExprSyntax& syntax,
                                              const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& cond = bindExpr(*syntax.condition, context);
    auto& expr = bind(*syntax.expr, context);

    Action action;
    bool isSync;
    switch (syntax.keyword.kind) {
        case TokenKind::AcceptOnKeyword:
            action = Accept;
            isSync = false;
            break;
        case TokenKind::SyncAcceptOnKeyword:
            action = Accept;
            isSync = true;
            break;
        case TokenKind::RejectOnKeyword:
            action = Reject;
            isSync = false;
            break;
        case TokenKind::SyncRejectOnKeyword:
            action = Reject;
            isSync = true;
            break;
        default:
            SLANG_UNREACHABLE;
    }

    checkSampledValueExpr(cond, context, false, diag::PropAbortLocalVar, diag::PropAbortMatched);

    return *comp.emplace<AbortAssertionExpr>(cond, expr, action, isSync);
}